

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_xlat.cpp
# Opt level: O3

int * Expr_Div(int *dest,int *xnode,FXlatExprState *state)

{
  int *piVar1;
  int iVar2;
  int local_30;
  int local_2c;
  
  piVar1 = (*XlatExprEval[xnode[-1]])(&local_2c,xnode + -1,state);
  piVar1 = (*XlatExprEval[*piVar1])(&local_30,piVar1,state);
  if (local_2c == 0) {
    iVar2 = 0;
    Printf("Xlat: Division by 0 for line type %d\n",(ulong)(uint)state->linetype);
  }
  else {
    iVar2 = local_30 / local_2c;
  }
  *dest = iVar2;
  return piVar1;
}

Assistant:

static const int *Expr_Div(int *dest, const int *xnode, FXlatExprState *state)
{
	int op1, op2;

	xnode = XlatExprEval[xnode[-1]](&op2, xnode-1, state);
	xnode = XlatExprEval[xnode[0]](&op1, xnode, state);
	Div0Check(op1, op2, state);
	*dest = op1 / op2;
	return xnode;
}